

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::value::StringData>
          (AsciiParser *this,
          vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *result)

{
  bool bVar1;
  char c;
  char local_19;
  
  bVar1 = Expect(this,'[');
  if ((bVar1) && (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)) {
    bVar1 = Char1(this,&local_19);
    if (!bVar1) {
      return bVar1;
    }
    if (local_19 == ']') {
      ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
      _M_erase_at_end(result,(result->
                             super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                             )._M_impl.super__Vector_impl_data._M_start);
      return bVar1;
    }
    Rewind(this,1);
    bVar1 = SepBy1BasicType<tinyusdz::value::StringData>(this,',',']',result);
    if ((bVar1) && (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)) {
      bVar1 = Expect(this,']');
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<T> *result) {
  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1BasicType<T>(',', ']', result)) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }
  return true;
}